

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O2

type dlib::
     matrix_assign_default<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>>
               (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *dest,matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                      *src,type alpha,bool add_to)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined7 in_register_00000011;
  long c;
  long lVar4;
  long lVar5;
  long r;
  long lVar6;
  type tVar7;
  undefined1 auVar8 [64];
  undefined1 extraout_var [60];
  
  if ((int)CONCAT71(in_register_00000011,add_to) == 0) {
    lVar5 = 0;
    lVar6 = 0;
    if ((alpha != 1.0) || (NAN(alpha))) {
      for (; lVar6 < (((((src->lhs->op).m)->op).m)->op).rows; lVar6 = lVar6 + 1) {
        for (lVar4 = 0; lVar4 < (((((src->rhs->op).m)->op).m)->op).cols; lVar4 = lVar4 + 1) {
          tVar7 = matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                  ::operator()(src,lVar6,lVar4);
          *(float *)((long)(dest->data).data + lVar4 * 4 + (dest->data).nc_ * lVar5) = tVar7 * alpha
          ;
        }
        lVar5 = lVar5 + 4;
      }
    }
    else {
      for (; lVar6 < (((((src->lhs->op).m)->op).m)->op).rows; lVar6 = lVar6 + 1) {
        for (lVar4 = 0; lVar4 < (((((src->rhs->op).m)->op).m)->op).cols; lVar4 = lVar4 + 1) {
          tVar7 = matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                  ::operator()(src,lVar6,lVar4);
          *(type *)((long)(dest->data).data + lVar4 * 4 + (dest->data).nc_ * lVar5) = tVar7;
        }
        lVar5 = lVar5 + 4;
      }
    }
  }
  else {
    lVar5 = 0;
    lVar6 = 0;
    if ((alpha != 1.0) || (NAN(alpha))) {
      if ((alpha != -1.0) || (NAN(alpha))) {
        for (; lVar6 < (((((src->lhs->op).m)->op).m)->op).rows; lVar6 = lVar6 + 1) {
          for (lVar4 = 0; lVar4 < (((((src->rhs->op).m)->op).m)->op).cols; lVar4 = lVar4 + 1) {
            auVar8._0_4_ = matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                           ::operator()(src,lVar6,lVar4);
            auVar8._4_60_ = extraout_var;
            lVar3 = (dest->data).nc_ * lVar5;
            pfVar1 = (dest->data).data;
            auVar2 = vfmadd213ss_fma(auVar8._0_16_,ZEXT416((uint)alpha),
                                     ZEXT416(*(uint *)((long)pfVar1 + lVar4 * 4 + lVar3)));
            *(int *)((long)pfVar1 + lVar4 * 4 + lVar3) = auVar2._0_4_;
          }
          lVar5 = lVar5 + 4;
        }
      }
      else {
        for (; lVar6 < (((((src->lhs->op).m)->op).m)->op).rows; lVar6 = lVar6 + 1) {
          for (lVar4 = 0; lVar4 < (((((src->rhs->op).m)->op).m)->op).cols; lVar4 = lVar4 + 1) {
            tVar7 = matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                    ::operator()(src,lVar6,lVar4);
            lVar3 = (dest->data).nc_ * lVar5;
            pfVar1 = (dest->data).data;
            *(float *)((long)pfVar1 + lVar4 * 4 + lVar3) =
                 *(float *)((long)pfVar1 + lVar4 * 4 + lVar3) - tVar7;
          }
          lVar5 = lVar5 + 4;
        }
      }
    }
    else {
      for (; lVar6 < (((((src->lhs->op).m)->op).m)->op).rows; lVar6 = lVar6 + 1) {
        for (lVar4 = 0; lVar4 < (((((src->rhs->op).m)->op).m)->op).cols; lVar4 = lVar4 + 1) {
          tVar7 = matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                  ::operator()(src,lVar6,lVar4);
          lVar3 = (dest->data).nc_ * lVar5;
          pfVar1 = (dest->data).data;
          *(float *)((long)pfVar1 + lVar4 * 4 + lVar3) =
               tVar7 + *(float *)((long)pfVar1 + lVar4 * 4 + lVar3);
        }
        lVar5 = lVar5 + 4;
      }
    }
  }
  return;
}

Assistant:

inline typename disable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src,
        typename EXP2::type alpha,
        bool add_to
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - if (add_to == false) then
                - #dest == alpha*src
            - else
                - #dest == dest + alpha*src
    !*/
    {
        if (add_to)
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += src(r,c);
                    }
                }
            }
            else if (alpha == static_cast<typename EXP2::type>(-1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) -= src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += alpha*src(r,c);
                    }
                }
            }
        }
        else
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = alpha*src(r,c);
                    }
                }
            }
        }
    }